

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O2

void __thiscall QLineEditPrivate::completionHighlighted(QLineEditPrivate *this,QString *newText)

{
  int pos;
  QLineEdit *this_00;
  CompletionMode CVar1;
  undefined1 *pos_00;
  long in_FS_OFFSET;
  QStringView local_a0;
  QStringBuilder<QStringView,_QStringView> local_90;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEdit **)&(this->super_QWidgetPrivate).field_0x8;
  CVar1 = QCompleter::completionMode((QCompleter *)(this->control->m_completer).wp.value);
  if (CVar1 == InlineCompletion) {
    pos = this->control->m_cursor;
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QWidgetLineControl::text((QString *)&local_58,(QWidgetLineControl *)this->control);
    local_90.a.m_data = local_58.ptr;
    pos_00 = (undefined1 *)(long)pos;
    local_90.a.m_size = local_58.size;
    if (pos_00 <= (ulong)local_58.size) {
      local_90.a.m_size = (qsizetype)pos_00;
    }
    local_a0.m_data = (newText->d).ptr;
    local_a0.m_size = (newText->d).size;
    local_90.b = QStringView::mid(&local_a0,(qsizetype)pos_00,-1);
    QStringBuilder<QStringView,_QStringView>::convertTo<QString>((QString *)&local_70,&local_90);
    QLineEdit::setText(this_00,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QWidgetLineControl::moveCursor
              ((QWidgetLineControl *)this->control,(int)(this->control->m_text).d.size,false);
    QWidgetLineControl::moveCursor((QWidgetLineControl *)this->control,pos,true);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QLineEdit::setText(this_00,newText);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEditPrivate::completionHighlighted(const QString &newText)
{
    Q_Q(QLineEdit);
    if (control->completer()->completionMode() != QCompleter::InlineCompletion) {
        q->setText(newText);
    } else {
        int c = control->cursor();
        QString text = control->text();
        q->setText(QStringView{text}.left(c) + QStringView{newText}.mid(c));
        control->moveCursor(control->end(), false);
#ifndef Q_OS_ANDROID
        const bool mark = true;
#else
        const bool mark = (imHints & Qt::ImhNoPredictiveText);
#endif
        control->moveCursor(c, mark);
    }
}